

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItemPrivate::appendGraphicsTransform(QGraphicsItemPrivate *this,QGraphicsTransform *t)

{
  bool bVar1;
  TransformData *pTVar2;
  long lVar3;
  qreal *pqVar4;
  TransformData *pTVar5;
  long in_FS_OFFSET;
  byte bVar6;
  QGraphicsTransform *t_local;
  long local_10;
  
  bVar6 = 0;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar2 = this->transformData;
  t_local = t;
  if (pTVar2 == (TransformData *)0x0) {
    pTVar2 = (TransformData *)operator_new(0x90);
    pqVar4 = (qreal *)&DAT_006777b8;
    pTVar5 = pTVar2;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pTVar5->transform).m_matrix[0][0] = *pqVar4;
      pqVar4 = pqVar4 + (ulong)bVar6 * -2 + 1;
      pTVar5 = (TransformData *)((long)pTVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    *(undefined2 *)&(pTVar2->transform).field_0x48 = 0;
    pTVar2->scale = 1.0;
    pTVar2->rotation = 0.0;
    pTVar2->xOrigin = 0.0;
    pTVar2->yOrigin = 0.0;
    (pTVar2->graphicsTransforms).d.d = (Data *)0x0;
    (pTVar2->graphicsTransforms).d.ptr = (QGraphicsTransform **)0x0;
    (pTVar2->graphicsTransforms).d.size = 0;
    pTVar2->onlyTransform = true;
    this->transformData = pTVar2;
  }
  bVar1 = QListSpecialMethodsBase<QGraphicsTransform*>::contains<QGraphicsTransform*>
                    ((QListSpecialMethodsBase<QGraphicsTransform*> *)&pTVar2->graphicsTransforms,
                     &t_local);
  if (!bVar1) {
    QList<QGraphicsTransform_*>::append(&this->transformData->graphicsTransforms,t_local);
  }
  QGraphicsTransformPrivate::setItem(*(QGraphicsTransformPrivate **)&t_local->field_0x8,this->q_ptr)
  ;
  this->transformData->onlyTransform = false;
  this->field_0x166 = this->field_0x166 | 0x20;
  (*this->_vptr_QGraphicsItemPrivate[4])(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemPrivate::appendGraphicsTransform(QGraphicsTransform *t)
{
    if (!transformData)
        transformData = new QGraphicsItemPrivate::TransformData;
    if (!transformData->graphicsTransforms.contains(t))
        transformData->graphicsTransforms.append(t);

    Q_Q(QGraphicsItem);
    t->d_func()->setItem(q);
    transformData->onlyTransform = false;
    dirtySceneTransform = 1;
    transformChanged();
}